

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O2

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  VectorXd *this_01;
  long lVar1;
  long lVar2;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar3;
  double dVar4;
  double dVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  double *pdVar8;
  CoeffReturnType pdVar9;
  ostream *poVar10;
  invalid_argument e;
  DenseIndex local_e0;
  DenseIndex DStack_d8;
  VectorXd z;
  double y;
  double local_b0;
  Scalar local_a8;
  Scalar local_a0;
  double local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  double local_38;
  
  if (this->is_initialized_ == false) {
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         CONCAT44(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
                  _4_4_,4);
    y = (double)CONCAT44(y._4_4_,4);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&e,(int *)&z,(int *)&y);
    pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)_e;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e0;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = DStack_d8;
    _e = pMVar3;
    free(pMVar3);
    *(this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    _e = &(this->ekf_).P_;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&e,
                        (Scalar *)&z);
    y = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&y);
    local_a0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_a0);
    local_a8 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_a8);
    local_40 = 1.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_40);
    local_48 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_48);
    local_50 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_50);
    local_58 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_58);
    local_60 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_60);
    local_68 = 1000.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_68);
    local_70 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_70);
    local_78 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_78);
    local_80 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_80);
    local_88 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_88);
    local_90 = 1000.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&local_90);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&e);
    if (measurement_pack->sensor_type_ == LASER) {
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &measurement_pack->raw_measurements_,0);
      *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data = *pdVar9;
      _e = (MatrixXd *)&(this->ekf_).x_;
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &measurement_pack->raw_measurements_,1);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e,pdVar9);
      z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar7,(Scalar *)&z);
      y = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&y);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e);
    }
    else if (measurement_pack->sensor_type_ == RADAR) {
      this_01 = &measurement_pack->raw_measurements_;
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_01,0);
      local_b0 = *pdVar9;
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_01,1);
      local_98 = *pdVar9;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_01,2);
      local_38 = cos(local_98);
      local_38 = local_38 * local_b0;
      dVar4 = sin(local_98);
      y = dVar4 * local_b0;
      z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)Eigen::internal::aligned_malloc(0x20);
      z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 4;
      *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_38;
      _e = (Matrix<double,__1,__1,_0,__1,__1> *)&z;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e,&y);
      local_a0 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar7,&local_a0);
      local_a8 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_a8);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&(this->ekf_).x_,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    this->previous_timestamp_ = measurement_pack->timestamp_;
    this->is_initialized_ = true;
  }
  else {
    lVar1 = measurement_pack->timestamp_;
    lVar2 = this->previous_timestamp_;
    this->previous_timestamp_ = lVar1;
    _e = &(this->ekf_).F_;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&e,
                        (Scalar *)&z);
    dVar4 = (double)(float)((double)(lVar1 - lVar2) / 1000000.0);
    y = dVar4;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&y);
    local_a0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_a0);
    local_a8 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_a8);
    local_40 = 1.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_40);
    local_48 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_48);
    local_50 = dVar4;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_50);
    local_58 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_58);
    local_60 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_60);
    local_68 = 1.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_68);
    local_70 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_70);
    local_78 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_78);
    local_80 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_80);
    local_88 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_88);
    local_90 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&local_90);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&e);
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         CONCAT44(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
                  _4_4_,4);
    y = (double)CONCAT44(y._4_4_,4);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&e,(int *)&z,(int *)&y);
    pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)_e;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 1;
    _e = pMVar3;
    free(pMVar3);
    dVar5 = pow(dVar4,4.0);
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)this->noise_ax * dVar5 * 0.25;
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    _e = &(this->ekf_).Q_;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&e,
                        (Scalar *)&z);
    dVar5 = pow(dVar4,3.0);
    y = (double)this->noise_ax * dVar5 * 0.5;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&y);
    local_a0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_a0);
    local_a8 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_a8);
    dVar5 = pow(dVar4,4.0);
    local_40 = (double)this->noise_ay * dVar5 * 0.25;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_40);
    local_48 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_48);
    dVar5 = pow(dVar4,3.0);
    local_50 = (double)this->noise_ay * dVar5 * 0.5;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_50);
    dVar5 = pow(dVar4,3.0);
    local_58 = (double)this->noise_ax * dVar5 * 0.5;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_58);
    local_60 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_60);
    local_b0 = dVar4 * dVar4;
    local_68 = (double)this->noise_ax * local_b0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_68);
    local_70 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_70);
    local_78 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_78);
    dVar4 = pow(dVar4,3.0);
    local_80 = (double)this->noise_ay * dVar4 * 0.5;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_80);
    local_88 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_88);
    local_90 = local_b0 * (double)this->noise_ay;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&local_90);
    this_00 = &this->ekf_;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&e);
    KalmanFilter::Predict(this_00);
    if (measurement_pack->sensor_type_ == RADAR) {
      Tools::CalculateJacobian((MatrixXd *)&e,&this->tools,&(this->ekf_).x_);
      pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
               (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           = (double *)_e;
      (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
           = 0;
      (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
           = 1;
      _e = pMVar3;
      free(pMVar3);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Hj_);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
      KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
    }
    else {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
      pdVar8 = (double *)Eigen::internal::aligned_malloc(0x10);
      z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
      z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar8;
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &measurement_pack->raw_measurements_,0);
      *pdVar8 = *pdVar9;
      _e = (Matrix<double,__1,__1,_0,__1,__1> *)&z;
      pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &measurement_pack->raw_measurements_,1);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e,pdVar9);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e);
      KalmanFilter::Update(this_00,&z);
      free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    poVar10 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                        &(this->ekf_).x_);
    std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        &(this->ekf_).P_);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {
  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {

    //state covariance matrix P
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      //Convert radar from polar to cartesian coordinates and initialize state.
      double ro = measurement_pack.raw_measurements_[0];
      double theta = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      double x = ro * std::cos(theta);
      double y = ro * std::sin(theta);

      VectorXd cartesian_measurement = VectorXd(4);
      cartesian_measurement << x, y, 0, 0;

      ekf_.x_ = cartesian_measurement;
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      //Initialize state.
      ekf_.x_ << measurement_pack.raw_measurements_[0],
          measurement_pack.raw_measurements_[1],
          0,
          0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;
  previous_timestamp_ = measurement_pack.timestamp_;

  // Modify the F matrix so that the time is integrated
  ekf_.F_ << 1, 0, dt, 0,
            0, 1, 0, dt,
            0, 0, 1, 0,
            0, 0, 0, 1;

  // Set the process covariance matrix Q
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ <<  (pow(dt, 4)/4)*noise_ax, 0, (pow(dt, 3)/2)*noise_ax, 0,
          0, (pow(dt, 4)/4)*noise_ay, 0, (pow(dt, 3)/2)*noise_ay,
          (pow(dt, 3)/2)*noise_ax, 0, (pow(dt, 2))*noise_ax, 0,
          0, (pow(dt, 3)/2)*noise_ay, 0, (pow(dt, 2))*noise_ay;

  // Call the Kalman Filter predict() function
  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    try {
      // Radar updates
      Hj_ = tools.CalculateJacobian(ekf_.x_);
      ekf_.H_ = Hj_;
      ekf_.R_ = R_radar_;
      ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    } catch (std::invalid_argument e) {
      cout << "Exception in radar update: " << e.what() << '\n';
    }
  } else {
    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    VectorXd z(2);
    z << measurement_pack.raw_measurements_[0],
        measurement_pack.raw_measurements_[1];
    ekf_.Update(z);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}